

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O2

int luaB_error(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  
  lVar2 = luaL_optinteger(L,2,1);
  lua_settop(L,1);
  iVar1 = lua_isstring(L,1);
  if ((0 < (int)lVar2) && (iVar1 != 0)) {
    luaL_where(L,(int)lVar2);
    lua_pushvalue(L,1);
    lua_concat(L,2);
  }
  iVar1 = lua_error(L);
  return iVar1;
}

Assistant:

static int luaB_error (lua_State *L) {
  int level = luaL_optint(L, 2, 1);
  lua_settop(L, 1);
  if (lua_isstring(L, 1) && level > 0) {  /* add extra information? */
    luaL_where(L, level);
    lua_pushvalue(L, 1);
    lua_concat(L, 2);
  }
  return lua_error(L);
}